

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::SPxLPBase<double>::doAddCol(SPxLPBase<double> *this,LPColBase<double> *col,bool scale)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  SVectorBase<double> *this_00;
  int *piVar6;
  byte in_DL;
  undefined8 extraout_RDX;
  undefined8 uVar7;
  undefined8 extraout_RDX_00;
  long *in_RDI;
  Real RVar8;
  int k;
  LPRowBase<double> empty;
  double val;
  int i;
  int j;
  DataArray<int> *rowscaleExp;
  SVectorBase<double> *vec;
  int newColScaleExp;
  int oldRowNumber;
  int idx;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  int in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  LPRowBase<double> *in_stack_ffffffffffffff28;
  LPRowSetBase<double> *in_stack_ffffffffffffff30;
  int local_7c;
  uint local_34;
  int local_20;
  
  iVar2 = nCols((SPxLPBase<double> *)0x235874);
  iVar3 = nRows((SPxLPBase<double> *)0x235885);
  local_20 = 0;
  LPColSetBase<double>::add
            ((LPColSetBase<double> *)in_stack_ffffffffffffff30,
             (LPColBase<double> *)in_stack_ffffffffffffff28);
  if ((int)in_RDI[0x32] != 1) {
    pdVar5 = LPColSetBase<double>::maxObj_w
                       ((LPColSetBase<double> *)
                        CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                        in_stack_ffffffffffffff1c);
    *pdVar5 = *pdVar5 * -1.0;
  }
  this_00 = colVector_w((SPxLPBase<double> *)
                        CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                        in_stack_ffffffffffffff1c);
  if ((in_DL & 1) != 0) {
    local_20 = (**(code **)(*(long *)in_RDI[0x35] + 8))
                         ((long *)in_RDI[0x35],this_00,(DataArray<int> *)(in_RDI + 0x16));
    pdVar5 = upper((SPxLPBase<double> *)
                   CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   in_stack_ffffffffffffff1c);
    dVar1 = *pdVar5;
    pdVar5 = (double *)infinity();
    if (dVar1 < *pdVar5) {
      upper_w((SPxLPBase<double> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
              in_stack_ffffffffffffff1c);
      RVar8 = spxLdexp((Real)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       in_stack_ffffffffffffff1c);
      pdVar5 = upper_w((SPxLPBase<double> *)
                       CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       in_stack_ffffffffffffff1c);
      *pdVar5 = RVar8;
    }
    pdVar5 = lower((SPxLPBase<double> *)
                   CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   in_stack_ffffffffffffff1c);
    dVar1 = *pdVar5;
    pdVar5 = (double *)infinity();
    if (-*pdVar5 < dVar1) {
      lower_w((SPxLPBase<double> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
              in_stack_ffffffffffffff1c);
      RVar8 = spxLdexp((Real)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       in_stack_ffffffffffffff1c);
      pdVar5 = lower_w((SPxLPBase<double> *)
                       CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       in_stack_ffffffffffffff1c);
      *pdVar5 = RVar8;
    }
    maxObj_w((SPxLPBase<double> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff1c);
    RVar8 = spxLdexp((Real)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                     in_stack_ffffffffffffff1c);
    pdVar5 = maxObj_w((SPxLPBase<double> *)
                      CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                      in_stack_ffffffffffffff1c);
    *pdVar5 = RVar8;
    piVar6 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x2f),iVar2);
    *piVar6 = local_20;
  }
  local_34 = SVectorBase<double>::size(this_00);
  uVar7 = extraout_RDX;
  while (local_34 = local_34 - 1, -1 < (int)local_34) {
    piVar6 = (int *)SVectorBase<double>::index(this_00,(char *)(ulong)local_34,(int)uVar7);
    iVar2 = *piVar6;
    if ((in_DL & 1) != 0) {
      pdVar5 = SVectorBase<double>::value(this_00,local_34);
      in_stack_ffffffffffffff28 = (LPRowBase<double> *)*pdVar5;
      in_stack_ffffffffffffff24 = local_20;
      DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 0x16),iVar2);
      in_stack_ffffffffffffff30 =
           (LPRowSetBase<double> *)
           spxLdexp((Real)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                    in_stack_ffffffffffffff1c);
      pdVar5 = SVectorBase<double>::value(this_00,local_34);
      *pdVar5 = (double)in_stack_ffffffffffffff30;
    }
    SVectorBase<double>::value(this_00,local_34);
    in_stack_ffffffffffffff20 = iVar2;
    iVar4 = nRows((SPxLPBase<double> *)0x235bb1);
    if (iVar4 <= in_stack_ffffffffffffff20) {
      LPRowBase<double>::LPRowBase
                ((LPRowBase<double> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 in_stack_ffffffffffffff1c);
      in_stack_ffffffffffffff1c = nRows((SPxLPBase<double> *)0x235bd1);
      for (local_7c = in_stack_ffffffffffffff1c; local_7c <= iVar2; local_7c = local_7c + 1) {
        LPRowSetBase<double>::add(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      }
      LPRowBase<double>::~LPRowBase((LPRowBase<double> *)0x235c33);
    }
    LPRowSetBase<double>::add2
              (in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
               (int)in_stack_ffffffffffffff28,
               (int *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (double *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    uVar7 = extraout_RDX_00;
  }
  (**(code **)(*in_RDI + 0x288))(in_RDI,1);
  iVar2 = nRows((SPxLPBase<double> *)0x235c8c);
  (**(code **)(*in_RDI + 0x280))(in_RDI,iVar2 - iVar3);
  return;
}

Assistant:

void doAddCol(const LPColBase<R>& col, bool scale = false)
   {
      int idx = nCols();
      int oldRowNumber = nRows();
      int newColScaleExp = 0;

      LPColSetBase<R>::add(col);

      if(thesense != MAXIMIZE)
         LPColSetBase<R>::maxObj_w(idx) *= -1;

      SVectorBase<R>& vec = colVector_w(idx);

      DataArray <int>& rowscaleExp = LPRowSetBase<R>::scaleExp;

      // compute new column scaling factor and apply it to the bounds
      if(scale)
      {
         newColScaleExp = lp_scaler->computeScaleExp(vec, rowscaleExp);

         if(upper(idx) < R(infinity))
            upper_w(idx) = spxLdexp(upper_w(idx), - newColScaleExp);

         if(lower(idx) > R(-infinity))
            lower_w(idx) = spxLdexp(lower_w(idx), - newColScaleExp);

         maxObj_w(idx) = spxLdexp(maxObj_w(idx), newColScaleExp);

         LPColSetBase<R>::scaleExp[idx] = newColScaleExp;
      }

      // now insert nonzeros to row file also
      for(int j = vec.size() - 1; j >= 0; --j)
      {
         int i = vec.index(j);

         // apply new column and existing row scaling factors to new values in ColSet
         if(scale)
            vec.value(j) = spxLdexp(vec.value(j), newColScaleExp + rowscaleExp[i]);

         R val = vec.value(j);

         // create new rows if required
         if(i >= nRows())
         {
            LPRowBase<R> empty;

            for(int k = nRows(); k <= i; ++k)
               LPRowSetBase<R>::add(empty);
         }

         assert(i < nRows());
         LPRowSetBase<R>::add2(i, 1, &idx, &val);
      }

      addedCols(1);
      addedRows(nRows() - oldRowNumber);
   }